

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

bool __thiscall cmCTestLaunch::ScrapeLog(cmCTestLaunch *this,string *fname)

{
  cmCTestLaunchReporter *this_00;
  bool bVar1;
  bool bVar2;
  string line;
  ifstream fin;
  
  LoadScrapeRules(this);
  std::ifstream::ifstream((istream *)&fin,(fname->_M_dataplus)._M_p,_S_in|_S_bin);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  this_00 = &this->Reporter;
  do {
    do {
      do {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&fin,&line,(bool *)0x0,0xffffffffffffffff);
        if (!bVar1) goto LAB_001bdf82;
        bVar2 = cmCTestLaunchReporter::MatchesFilterPrefix(this_00,&line);
      } while (bVar2);
      bVar2 = cmCTestLaunchReporter::Match(this_00,&line,&(this->Reporter).RegexWarning);
    } while (!bVar2);
    bVar2 = cmCTestLaunchReporter::Match(this_00,&line,&(this->Reporter).RegexWarningSuppress);
  } while (bVar2);
LAB_001bdf82:
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&fin);
  return bVar1;
}

Assistant:

bool cmCTestLaunch::ScrapeLog(std::string const& fname)
{
  this->LoadScrapeRules();

  // Look for log file lines matching warning expressions but not
  // suppression expressions.
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  std::string line;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (this->Reporter.MatchesFilterPrefix(line)) {
      continue;
    }

    if (this->Reporter.Match(line, this->Reporter.RegexWarning) &&
        !this->Reporter.Match(line, this->Reporter.RegexWarningSuppress)) {
      return true;
    }
  }
  return false;
}